

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O2

void * metacallfms_await(void *func,char *buffer,size_t size,void *allocator,
                        _func_void_ptr_void_ptr_void_ptr *resolve_callback,
                        _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  type_id tVar1;
  type_id tVar2;
  int iVar3;
  signature s;
  size_t sVar4;
  function_return v;
  type ptVar5;
  value pvVar6;
  void *v_00;
  size_t sVar7;
  value *ppvVar8;
  value *ppvVar9;
  void *v_01;
  void *values [16];
  void *keys [16];
  void *local_138 [16];
  void *local_b8 [17];
  
  if (func != (void *)0x0) {
    s = function_signature((function_conflict)func);
    if (buffer == (char *)0x0 || size == 0) {
      sVar4 = signature_count(s);
      if (sVar4 == 0) {
        v = function_await((function_conflict)func,metacall_null_args,0,
                           (function_resolve_callback)resolve_callback,
                           (function_reject_callback)reject_callback,data);
        if (v == (function_return)0x0) {
          return (void *)0x0;
        }
        ptVar5 = signature_get_return(s);
        if (ptVar5 == (type)0x0) {
          return v;
        }
        tVar1 = type_index(ptVar5);
        tVar2 = value_type_id(v);
        if (tVar1 == tVar2) {
          return v;
        }
        pvVar6 = value_type_cast(v,tVar1);
        if (pvVar6 != (value)0x0) {
          return pvVar6;
        }
        return v;
      }
    }
    else {
      v_00 = metacall_deserialize("rapid_json",buffer,size,allocator);
      if (v_00 != (void *)0x0) {
        tVar1 = value_type_id(v_00);
        iVar3 = type_id_map(tVar1);
        if (iVar3 == 0) {
          sVar4 = signature_count(s);
          sVar7 = value_type_count(v_00);
          if (sVar4 == sVar7) {
            ppvVar8 = value_to_map(v_00);
            for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
              ppvVar9 = value_to_array(ppvVar8[sVar7]);
              pvVar6 = value_type_copy(*ppvVar9);
              local_b8[sVar7] = pvVar6;
              pvVar6 = value_type_copy(ppvVar9[1]);
              local_138[sVar7] = pvVar6;
            }
            v_01 = metacallfmv_await(func,local_b8,local_138,resolve_callback,reject_callback,data);
            for (sVar7 = 0; sVar4 != sVar7; sVar7 = sVar7 + 1) {
              value_type_destroy(local_b8[sVar7]);
              value_type_destroy(local_138[sVar7]);
            }
            value_type_destroy(v_00);
            if (v_01 == (void *)0x0) {
              return (void *)0x0;
            }
            ptVar5 = signature_get_return(s);
            if (ptVar5 == (type)0x0) {
              return v_01;
            }
            tVar1 = type_index(ptVar5);
            tVar2 = value_type_id(v_01);
            if (tVar1 != tVar2) {
              pvVar6 = value_type_cast(v_01,tVar1);
              if (pvVar6 != (value)0x0) {
                return pvVar6;
              }
              return v_01;
            }
            return v_01;
          }
        }
        value_type_destroy(v_00);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *metacallfms_await(void *func, const char *buffer, size_t size, void *allocator, void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	function f = (function)func;

	if (f != NULL)
	{
		signature s = function_signature(f);

		if (buffer == NULL || size == 0)
		{
			if (signature_count(s) == 0)
			{
				value ret = function_await(f, metacall_null_args, 0, resolve_callback, reject_callback, data);

				if (ret != NULL)
				{
					type t = signature_get_return(s);

					if (t != NULL)
					{
						type_id id = type_index(t);

						if (id != value_type_id(ret))
						{
							value cast_ret = value_type_cast(ret, id);

							return (cast_ret == NULL) ? ret : cast_ret;
						}
					}
				}

				return ret;
			}

			return NULL;
		}
		else
		{
			void *keys[METACALL_ARGS_SIZE];
			void *values[METACALL_ARGS_SIZE];

			value *v_map, ret, v = (value)metacall_deserialize(metacall_serial(), buffer, size, allocator);

			size_t iterator, args_count;

			if (v == NULL)
			{
				return NULL;
			}

			if (type_id_map(value_type_id(v)) != 0)
			{
				value_type_destroy(v);

				return NULL;
			}

			args_count = signature_count(s);

			/* TODO: No optional arguments allowed, review in the future */
			if (args_count != value_type_count(v))
			{
				value_type_destroy(v);

				return NULL;
			}

			v_map = value_to_map(v);

			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value element = v_map[iterator];
				value *v_element = value_to_array(element);

				/* This step is necessary in order to handle type castings */
				keys[iterator] = value_type_copy(v_element[0]);
				values[iterator] = value_type_copy(v_element[1]);
			}

			ret = metacallfmv_await(f, keys, values, resolve_callback, reject_callback, data);

			/* This step is necessary in order to handle type castings (otherwise it generates leaks) */
			for (iterator = 0; iterator < args_count; ++iterator)
			{
				value_type_destroy(keys[iterator]);
				value_type_destroy(values[iterator]);
			}

			value_type_destroy(v);

			if (ret != NULL)
			{
				type t = signature_get_return(s);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id(ret))
					{
						value cast_ret = value_type_cast(ret, id);

						if (cast_ret != NULL)
						{
							ret = cast_ret;
						}
					}
				}
			}

			return ret;
		}
	}

	return NULL;
}